

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_certificate.cc
# Opt level: O0

bool __thiscall
bssl::ParseValidity(bssl *this,Input validity_tlv,GeneralizedTime *not_before,
                   GeneralizedTime *not_after)

{
  Input input;
  bool bVar1;
  undefined1 local_70 [8];
  Parser validity_parser;
  undefined1 local_48 [8];
  Parser parser;
  GeneralizedTime *not_after_local;
  GeneralizedTime *not_before_local;
  Input validity_tlv_local;
  
  input.data_.size_ = (size_t)validity_tlv.data_.data_;
  input.data_.data_ = (uchar *)this;
  validity_parser.advance_len_ = (size_t)this;
  parser.advance_len_ = (size_t)not_before;
  der::Parser::Parser((Parser *)local_48,input);
  der::Parser::Parser((Parser *)local_70);
  bVar1 = der::Parser::ReadSequence((Parser *)local_48,(Parser *)local_70);
  if (bVar1) {
    bVar1 = ReadUTCOrGeneralizedTime((Parser *)local_70,(GeneralizedTime *)validity_tlv.data_.size_)
    ;
    if (bVar1) {
      bVar1 = ReadUTCOrGeneralizedTime((Parser *)local_70,(GeneralizedTime *)parser.advance_len_);
      if (bVar1) {
        bVar1 = der::Parser::HasMore((Parser *)local_48);
        if (bVar1) {
          validity_tlv_local.data_.size_._7_1_ = false;
        }
        else {
          bVar1 = der::Parser::HasMore((Parser *)local_70);
          if (bVar1) {
            validity_tlv_local.data_.size_._7_1_ = false;
          }
          else {
            validity_tlv_local.data_.size_._7_1_ = true;
          }
        }
      }
      else {
        validity_tlv_local.data_.size_._7_1_ = false;
      }
    }
    else {
      validity_tlv_local.data_.size_._7_1_ = false;
    }
  }
  else {
    validity_tlv_local.data_.size_._7_1_ = false;
  }
  return validity_tlv_local.data_.size_._7_1_;
}

Assistant:

bool ParseValidity(der::Input validity_tlv, der::GeneralizedTime *not_before,
                   der::GeneralizedTime *not_after) {
  der::Parser parser(validity_tlv);

  //     Validity ::= SEQUENCE {
  der::Parser validity_parser;
  if (!parser.ReadSequence(&validity_parser)) {
    return false;
  }

  //          notBefore      Time,
  if (!ReadUTCOrGeneralizedTime(&validity_parser, not_before)) {
    return false;
  }

  //          notAfter       Time }
  if (!ReadUTCOrGeneralizedTime(&validity_parser, not_after)) {
    return false;
  }

  // By definition the input was a single Validity sequence, so there shouldn't
  // be unconsumed data.
  if (parser.HasMore()) {
    return false;
  }

  // The Validity type does not have an extension point.
  if (validity_parser.HasMore()) {
    return false;
  }

  // Note that RFC 5280 doesn't require notBefore to be <=
  // notAfter, so that will not be considered a "parsing" error here. Instead it
  // will be considered an expired certificate later when testing against the
  // current timestamp.
  return true;
}